

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggressivePlayerStrategy.cpp
# Opt level: O0

void __thiscall
AggressivePlayerStrategy::execute(AggressivePlayerStrategy *this,Game *game,Player *player)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  Map *pMVar6;
  allocator local_101;
  string local_100;
  string local_e0;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  string local_40 [8];
  string choice;
  Player *player_local;
  Game *game_local;
  AggressivePlayerStrategy *this_local;
  
  choice.field_2._8_8_ = player;
  Player::rollAggressive(player);
  Game::resolvePlayer(game,(Player *)choice.field_2._8_8_,false);
  iVar3 = Player::getLifePoints((Player *)choice.field_2._8_8_);
  if (iVar3 < 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar5 = Player::getPlayerName_abi_cxx11_((Player *)choice.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," died while resolving dice");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar3 = Player::getZone((Player *)choice.field_2._8_8_);
    if ((iVar3 < 1) || (iVar3 = Player::getZone((Player *)choice.field_2._8_8_), 6 < iVar3)) {
      pMVar6 = Game::getGameMap(game);
      bVar2 = Map::isManhattanEmpty(pMVar6);
      if (bVar2) {
        Player::setPhase((Player *)choice.field_2._8_8_,Move);
        iVar3 = Game::getNumberOfPlayers(game);
        if (iVar3 < 5) {
          Player::setZone((Player *)choice.field_2._8_8_,1);
          pMVar6 = Game::getGameMap(game);
          Map::setRegionOwner(pMVar6,1,(Player *)choice.field_2._8_8_);
          poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
          psVar5 = Player::getPlayerName_abi_cxx11_((Player *)choice.field_2._8_8_);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          poVar4 = std::operator<<(poVar4," is in : ");
          Player::getZoneName_abi_cxx11_(&local_c0,(Player *)choice.field_2._8_8_);
          poVar4 = std::operator<<(poVar4,(string *)&local_c0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        else {
          Player::setZone((Player *)choice.field_2._8_8_,4);
          pMVar6 = Game::getGameMap(game);
          Map::setRegionOwner(pMVar6,4,(Player *)choice.field_2._8_8_);
          poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
          psVar5 = Player::getPlayerName_abi_cxx11_((Player *)choice.field_2._8_8_);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          poVar4 = std::operator<<(poVar4," is in : ");
          Player::getZoneName_abi_cxx11_(&local_e0,(Player *)choice.field_2._8_8_);
          poVar4 = std::operator<<(poVar4,(string *)&local_e0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_e0);
        }
      }
      else {
        pMVar6 = Game::getGameMap(game);
        uVar1 = choice.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_100,"aggressive",&local_101);
        Map::moveComputer(pMVar6,(Player *)uVar1,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
      }
    }
    else {
      Player::setPhase((Player *)choice.field_2._8_8_,Move);
      std::__cxx11::string::string(local_40);
      iVar3 = Player::getZone((Player *)choice.field_2._8_8_);
      if (iVar3 == 1) {
        Player::setZone((Player *)choice.field_2._8_8_,2);
        pMVar6 = Game::getGameMap(game);
        Map::setRegionOwner(pMVar6,2,(Player *)choice.field_2._8_8_);
      }
      else {
        iVar3 = Player::getZone((Player *)choice.field_2._8_8_);
        if (iVar3 == 2) {
          Player::setZone((Player *)choice.field_2._8_8_,3);
          pMVar6 = Game::getGameMap(game);
          Map::setRegionOwner(pMVar6,3,(Player *)choice.field_2._8_8_);
        }
        else {
          iVar3 = Player::getZone((Player *)choice.field_2._8_8_);
          if (iVar3 == 3) {
            pMVar6 = Game::getGameMap(game);
            uVar1 = choice.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_70,"outmanhattan",&local_71);
            Map::moveComputer(pMVar6,(Player *)uVar1,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::allocator<char>::~allocator((allocator<char> *)&local_71);
          }
          else {
            iVar3 = Player::getZone((Player *)choice.field_2._8_8_);
            if (iVar3 == 4) {
              Player::setZone((Player *)choice.field_2._8_8_,5);
              pMVar6 = Game::getGameMap(game);
              Map::setRegionOwner(pMVar6,5,(Player *)choice.field_2._8_8_);
            }
            else {
              iVar3 = Player::getZone((Player *)choice.field_2._8_8_);
              if (iVar3 == 5) {
                Player::setZone((Player *)choice.field_2._8_8_,6);
                pMVar6 = Game::getGameMap(game);
                Map::setRegionOwner(pMVar6,6,(Player *)choice.field_2._8_8_);
              }
              else {
                iVar3 = Player::getZone((Player *)choice.field_2._8_8_);
                if (iVar3 == 6) {
                  pMVar6 = Game::getGameMap(game);
                  uVar1 = choice.field_2._8_8_;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_98,"aggressive",&local_99);
                  Map::moveComputer(pMVar6,(Player *)uVar1,&local_98);
                  std::__cxx11::string::~string((string *)&local_98);
                  std::allocator<char>::~allocator((allocator<char> *)&local_99);
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string(local_40);
    }
    Game::buyCardsComputer(game,(Player *)choice.field_2._8_8_);
  }
  return;
}

Assistant:

void AggressivePlayerStrategy::execute(Game *game, Player *player) {

    /*
		The aggressive player strategy will have this player profile:
			- During dice rolls : Will reroll anything that is not Destruction or Attack.
			- Resolve dices : Will just resolve in whatever order the dices are returned.
			- Move : Will always try to get out off manhattan whenever he has the occasion, if not in manhattan will stay same position.
			- Buy cards: Will always try to buy a card.
	*/

    player->rollAggressive();
    // resolve the dice (mandatory) unordered
    game->resolvePlayer(player, false);

    if(player->getLifePoints() <= 0) {
        cout << "Player : " << player->getPlayerName() << " died while resolving dice" << endl;
        return;
    }
    // move

    // if player is in manhattan
    if(player->getZone()>0 && player->getZone()<7){
        player->setPhase(Player::Phase::Move);
        std::string choice;
        if(player->getZone() == 1) {  // Manhattan Lower 2-4
            player->setZone(2);
            game->getGameMap()->setRegionOwner(2, player);
        }
        else if(player->getZone() == 2) {  // Manhattan Midtown 2-4
            player->setZone(3);
            game->getGameMap()->setRegionOwner(3, player);
        }
        else if(player->getZone() == 3) {  // Manhattan Upper 2-4
                game->getGameMap()->moveComputer(player, "outmanhattan");
        }
        else if(player->getZone() == 4) {  // Manhattan Lower 5-6
            player->setZone(5);
            game->getGameMap()->setRegionOwner(5, player);
        }
        else if(player->getZone() == 5) {  // Manhattan Midtown 5-6
            player->setZone(6);
            game->getGameMap()->setRegionOwner(6, player);
        }
        else if(player->getZone() == 6) {  // Manhattan Upper 5-6

                game->getGameMap()->moveComputer(player, "aggressive");
        }


    }
    else { // Not in manhattan
        if(game->getGameMap()->isManhattanEmpty()){ // must move to manhattan if empty
            player->setPhase(Player::Phase::Move);
            if (game->getNumberOfPlayers() < 5){
                player->setZone(1);
                game->getGameMap()->setRegionOwner(1, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
            else{
                player->setZone(4);
                game->getGameMap()->setRegionOwner(4, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
        }
        else{ // there is atleast 1 player in manhattan
                game->getGameMap()->moveComputer(player, "aggressive");
        }

    }

    // buy cards (optional)
    game->buyCardsComputer(player);

}